

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::DefinePropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  PropertyId propId;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *argAction;
  TTDVar pvVar2;
  RecyclableObject *pRVar3;
  ScriptContext *pSVar4;
  undefined1 local_78 [8];
  PropertyDescriptor propertyDescriptorValue;
  RecyclableObject *__obj_1;
  Var propertyDescriptor;
  RecyclableObject *__obj;
  Var object;
  JsRTDoubleVarSingleScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)56>
                          (evt);
    pvVar2 = GetVarItem_0<2ul,1ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
    if ((__obj != (RecyclableObject *)0x0) &&
       (BVar1 = Js::JavascriptOperators::IsObject(__obj), BVar1 != 0)) {
      pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
      pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
      if (pSVar4 != scriptContext) {
        __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
      pvVar2 = GetVarItem_1<2ul,1ul>(argAction);
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
      if ((__obj_1 != (RecyclableObject *)0x0) &&
         (BVar1 = Js::JavascriptOperators::IsObject(__obj_1), BVar1 != 0)) {
        propertyDescriptorValue._40_8_ = Js::VarTo<Js::RecyclableObject>(__obj_1);
        pSVar4 = Js::RecyclableObject::GetScriptContext
                           ((RecyclableObject *)propertyDescriptorValue._40_8_);
        if (pSVar4 != scriptContext) {
          __obj_1 = (RecyclableObject *)
                    Js::CrossSite::MarshalVar
                              (scriptContext,(Var)propertyDescriptorValue._40_8_,false);
        }
        Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_78);
        Js::JavascriptOperators::ToPropertyDescriptor
                  (__obj_1,(PropertyDescriptor *)local_78,scriptContext);
        pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
        propId = GetPropertyIdItem<2ul,1ul>(argAction);
        Js::JavascriptOperators::DefineOwnPropertyDescriptor
                  (pRVar3,propId,(PropertyDescriptor *)local_78,true,scriptContext,
                   PropertyOperation_None);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void DefinePropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarSingleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarSingleScalarArgumentAction, EventKind::DefinePropertyActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(object, ctx);
            Js::Var propertyDescriptor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(propertyDescriptor, ctx);

            Js::PropertyDescriptor propertyDescriptorValue;
            Js::JavascriptOperators::ToPropertyDescriptor(propertyDescriptor, &propertyDescriptorValue, ctx);

            Js::JavascriptOperators::DefineOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(object), GetPropertyIdItem(action), propertyDescriptorValue, true, ctx);
        }